

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::SchemaSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientData *pCVar1;
  pointer this;
  string parameter;
  string sStack_68;
  CatalogSearchEntry local_48;
  
  Value::ToString_abi_cxx11_(&sStack_68,input);
  pCVar1 = ClientData::Get(context);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar1->catalog_search_path);
  CatalogSearchEntry::Parse(&local_48,&sStack_68);
  CatalogSearchPath::Set(this,&local_48,SET_SCHEMA);
  CatalogSearchEntry::~CatalogSearchEntry(&local_48);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  return;
}

Assistant:

void SchemaSetting::SetLocal(ClientContext &context, const Value &input) {
	auto parameter = input.ToString();
	auto &client_data = ClientData::Get(context);
	client_data.catalog_search_path->Set(CatalogSearchEntry::Parse(parameter), CatalogSetPathType::SET_SCHEMA);
}